

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# key-storage.c
# Opt level: O0

void ndn_key_storage_delete_ecc_key(uint32_t key_id)

{
  byte local_d;
  uint8_t i;
  uint32_t key_id_local;
  
  local_d = 0;
  while( true ) {
    if (9 < local_d) {
      return;
    }
    if ((storage.ecc_pub_keys[local_d].key_id != 0xffffffff) &&
       (key_id == storage.ecc_pub_keys[local_d].key_id)) break;
    local_d = local_d + 1;
  }
  storage.ecc_pub_keys[local_d].key_id = 0xffffffff;
  storage.ecc_prv_keys[local_d].key_id = 0xffffffff;
  return;
}

Assistant:

void
ndn_key_storage_delete_ecc_key(uint32_t key_id)
{
  for (uint8_t i = 0; i < NDN_SEC_SIGNING_KEYS_SIZE; i++) {
    if (storage.ecc_pub_keys[i].key_id != NDN_SEC_INVALID_KEY_ID) {
      if (key_id == storage.ecc_pub_keys[i].key_id) {
        storage.ecc_pub_keys[i].key_id = NDN_SEC_INVALID_KEY_ID;
        storage.ecc_prv_keys[i].key_id = NDN_SEC_INVALID_KEY_ID;
        return;
      }
    }
  }
}